

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_bcread.c
# Opt level: O0

GCtab * bcread_ktab(LexState *ls)

{
  int iVar1;
  LexState *ls_00;
  TValue *o_00;
  uint32_t local_78;
  uint32_t local_74;
  TValue local_60;
  TValue key;
  TValue *pTStack_50;
  MSize i_1;
  TValue *o;
  GCtab *pGStack_40;
  MSize i;
  GCtab *t;
  MSize nhash;
  MSize narray;
  LexState *ls_local;
  LexState *pLStack_20;
  uint32_t v_1;
  uint32_t local_14;
  LexState *pLStack_10;
  uint32_t v;
  
  _nhash = ls;
  pLStack_10 = ls;
  t._4_4_ = lj_buf_ruleb128(&ls->p);
  pLStack_20 = _nhash;
  local_14 = t._4_4_;
  t._0_4_ = lj_buf_ruleb128(&_nhash->p);
  if ((uint32_t)t == 0) {
    local_78 = 0;
  }
  else {
    if ((uint32_t)t == 1) {
      local_74 = 1;
    }
    else {
      iVar1 = 0x1f;
      if ((uint32_t)t - 1 != 0) {
        for (; (uint32_t)t - 1 >> iVar1 == 0; iVar1 = iVar1 + -1) {
        }
      }
      local_74 = iVar1 + 1;
    }
    local_78 = local_74;
  }
  ls_local._4_4_ = (uint32_t)t;
  pGStack_40 = lj_tab_new(_nhash->L,t._4_4_,local_78);
  if (t._4_4_ != 0) {
    pTStack_50 = (TValue *)(pGStack_40->array).ptr64;
    for (o._4_4_ = 0; o._4_4_ < t._4_4_; o._4_4_ = o._4_4_ + 1) {
      bcread_ktabk(_nhash,pTStack_50);
      pTStack_50 = pTStack_50 + 1;
    }
  }
  if ((uint32_t)t != 0) {
    for (key.field_4.it = 0; key.field_4.it < (uint32_t)t; key.field_4.it = key.field_4.it + 1) {
      bcread_ktabk(_nhash,&local_60);
      ls_00 = _nhash;
      o_00 = lj_tab_set(_nhash->L,pGStack_40,&local_60);
      bcread_ktabk(ls_00,o_00);
    }
  }
  return pGStack_40;
}

Assistant:

static GCtab *bcread_ktab(LexState *ls)
{
  MSize narray = bcread_uleb128(ls);
  MSize nhash = bcread_uleb128(ls);
  GCtab *t = lj_tab_new(ls->L, narray, hsize2hbits(nhash));
  if (narray) {  /* Read array entries. */
    MSize i;
    TValue *o = tvref(t->array);
    for (i = 0; i < narray; i++, o++)
      bcread_ktabk(ls, o);
  }
  if (nhash) {  /* Read hash entries. */
    MSize i;
    for (i = 0; i < nhash; i++) {
      TValue key;
      bcread_ktabk(ls, &key);
      lj_assertLS(!tvisnil(&key), "nil key");
      bcread_ktabk(ls, lj_tab_set(ls->L, t, &key));
    }
  }
  return t;
}